

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Inline.cpp
# Opt level: O2

Instr * __thiscall
Inline::InlineBuiltInFunction
          (Inline *this,Instr *callInstr,FunctionJITTimeInfo *inlineeData,OpCode inlineCallOpCode,
          FunctionJITTimeInfo *inlinerData,StackSym *symCallerThis,bool *pIsInlined,uint profileId,
          uint recursiveInlineDepth,Instr *funcObjCheckInsertInstr)

{
  undefined1 *puVar1;
  byte bVar2;
  Func *func;
  code *pcVar3;
  bool bVar4;
  BuiltinFunction BVar5;
  ArgSlot AVar6;
  OpCode opcode;
  uint uVar7;
  BuiltInFlags flags;
  int iVar8;
  uint uVar9;
  RegSlot RVar10;
  RegSlot RVar11;
  undefined4 *puVar12;
  SymOpnd *pSVar13;
  StackSym *pSVar14;
  Instr *pIVar15;
  char16 *inlineeName;
  FunctionJITTimeInfo *topFunc;
  ByteCodeUsesInstr *pBVar16;
  StackSym *pSVar17;
  Opnd *pOVar18;
  Opnd *src2Opnd;
  Instr *pIVar19;
  Instr *pIVar20;
  ByteCodeUsesInstr *this_00;
  Opnd *pOVar21;
  AddrOpnd *src2Opnd_00;
  RegOpnd *pRVar22;
  FunctionJITTimeInfo *inlineeData_00;
  Inline *this_01;
  Instr *pIVar23;
  long lVar24;
  Opnd *local_58;
  RegOpnd *local_40;
  
  if (callInstr == (Instr *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar12 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar12 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Inline.cpp"
                       ,0x804,"(callInstr)","callInstr");
    if (!bVar4) goto LAB_005006fa;
    *puVar12 = 0;
  }
  if (inlinerData == (FunctionJITTimeInfo *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar12 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar12 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Inline.cpp"
                       ,0x805,"(inlinerData)","inlinerData");
    if (!bVar4) goto LAB_005006fa;
    *puVar12 = 0;
  }
  if (inlineCallOpCode == EndOfBlock) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar12 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar12 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Inline.cpp"
                       ,0x806,"(inlineCallOpCode != 0)","inlineCallOpCode != 0");
    if (!bVar4) goto LAB_005006fa;
    *puVar12 = 0;
  }
  *pIsInlined = false;
  uVar7 = FunctionJITTimeInfo::GetLocalFunctionId(inlineeData);
  BVar5 = Js::JavascriptLibrary::GetBuiltInForFuncInfo(uVar7);
  bVar4 = CanInlineBuiltInFunction
                    (this,callInstr,inlineeData_00,inlineCallOpCode,inlinerData,BVar5,false);
  if (bVar4) {
    flags = Js::JavascriptLibrary::GetFlagsForBuiltIn(BVar5);
    pOVar21 = callInstr->m_src2;
    pSVar13 = IR::Opnd::AsSymOpnd(pOVar21);
    pSVar14 = Sym::AsStackSym(pSVar13->m_sym);
    AVar6 = StackSym::GetArgSlotNum(pSVar14);
    iVar8 = (AVar6 - 1) + (uint)((flags >> 0xc & 1) != 0);
    if (inlineCallOpCode == InlineFunctionApply) {
      pIVar15 = InlineApply(this,callInstr,inlineeData,inlinerData,symCallerThis,pIsInlined,
                            profileId,recursiveInlineDepth,iVar8 - (uint)((flags >> 0xc & 1) != 0));
      return pIVar15;
    }
    if ((inlineCallOpCode & ~ExtendedOpcodePrefix) == InlineFunctionCall) {
      pIVar15 = InlineCall(this,callInstr,inlineeData,inlinerData,symCallerThis,pIsInlined,profileId
                           ,recursiveInlineDepth,inlineCallOpCode == InlineCallInstanceFunction);
      return pIVar15;
    }
    inlineeName = Js::JavascriptLibrary::GetNameForBuiltIn(BVar5);
    topFunc = JITTimeWorkItem::GetJITTimeInfo(this->topFunc->m_workItem);
    bVar4 = Func::IsLoopBody(callInstr->m_func->topFunc);
    TraceInlining(inlinerData,inlineeName,(char16 *)0x0,0,topFunc,0,(FunctionJITTimeInfo *)0x0,
                  profileId,bVar4,(uint)BVar5._value);
    *pIsInlined = true;
    pSVar14 = IR::Opnd::GetStackSym(callInstr->m_src1);
    bVar2 = callInstr->m_src1->field_0xb;
    pBVar16 = EmitFixedMethodOrFunctionObjectChecksForBuiltIns
                        (this,callInstr,funcObjCheckInsertInstr,inlineeData,false,true,false,true);
    if (inlineCallOpCode == CallDirect) {
      pSVar17 = SymTable::GetArgSlotSym(callInstr->m_func->m_symTable,1);
      pSVar13 = IR::SymOpnd::New(&pSVar17->super_Sym,0,TyUint64,callInstr->m_func);
      pOVar18 = IR::Instr::UnlinkSrc1(callInstr);
      src2Opnd = IR::Instr::UnlinkSrc2(callInstr);
      pIVar15 = IR::Instr::New(ArgOut_A_InlineSpecialized,&pSVar13->super_Opnd,pOVar18,src2Opnd,
                               callInstr->m_func);
      IR::Instr::SetByteCodeOffset(pIVar15,callInstr);
      pIVar19 = IR::Instr::GetInsertBeforeByteCodeUsesInstr(callInstr);
      IR::Instr::InsertBefore(pIVar19,pIVar15);
      uVar7 = FunctionJITTimeInfo::GetLocalFunctionId(inlineeData);
      this_01 = (Inline *)(ulong)uVar7;
      BVar5 = Js::JavascriptLibrary::GetBuiltInForFuncInfo(uVar7);
      callInstr->m_opcode = CallDirect;
      SetupInlineInstrForCallDirect(this_01,BVar5,callInstr,pIVar15);
      WrapArgsOutWithCoerse(this_01,BVar5,callInstr);
      IR::Instr::MoveArgs(callInstr,true);
      pIVar15 = callInstr;
    }
    else {
      pIVar15 = InsertInlineeBuiltInStartEndTags(this,callInstr,(uint)AVar6,(Instr **)0x0);
      if (inlineCallOpCode == InlineArrayPop) {
        pIVar15->m_opcode = InlineNonTrackingBuiltInEnd;
      }
    }
    if (pBVar16 != (ByteCodeUsesInstr *)0x0) {
      IR::Instr::Unlink(&pBVar16->super_Instr);
      IR::Instr::InsertBefore(callInstr,&pBVar16->super_Instr);
    }
    bVar4 = Js::JavascriptLibrary::IsTypeSpecRequired(flags);
    pIVar19 = pIVar15;
    if (bVar4) {
      for (; pIVar19->m_opcode != InlineBuiltInStart; pIVar19 = pIVar19->m_prev) {
      }
      local_58 = callInstr->m_dst;
      if (inlineCallOpCode == InlineArrayPop || local_58 == (Opnd *)0x0) {
        if (1 < (ushort)(inlineCallOpCode - InlineArrayPop)) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar12 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
          *puVar12 = 1;
          bVar4 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Inline.cpp"
                             ,0x873,
                             "(inlineCallOpCode == Js::OpCode::InlineArrayPush || inlineCallOpCode == Js::OpCode::InlineArrayPop)"
                             ,"Currently Dst can be null only for InlineArrayPush/InlineArrayPop");
          if (!bVar4) goto LAB_005006fa;
          *puVar12 = 0;
        }
        local_40 = (RegOpnd *)0x0;
      }
      else {
        pSVar17 = StackSym::New(local_58->m_type,callInstr->m_func);
        local_40 = IR::RegOpnd::New(pSVar17,pSVar17->m_type,callInstr->m_func);
        local_58 = IR::Instr::UnlinkDst(callInstr);
        IR::Instr::SetDst(callInstr,&local_40->super_Opnd);
      }
      pIVar20 = IR::Instr::GetPrevRealInstrOrLabel(callInstr);
      pBVar16 = IR::ByteCodeUsesInstr::New(pIVar20);
      IR::ByteCodeUsesInstr::SetRemovedOpndSymbol
                (pBVar16,(bool)((bVar2 & 8) >> 3),(pSVar14->super_Sym).m_id);
      pIVar20 = pIVar15;
      if (inlineCallOpCode == InlineArrayPop) {
        pIVar20 = callInstr;
      }
      IR::Instr::InsertBefore(pIVar20,&pBVar16->super_Instr);
      if (local_40 != (RegOpnd *)0x0) {
        opcode = Func::GetLoadOpForType(local_58->m_type);
        pIVar20 = IR::Instr::New(opcode,local_58,&local_40->super_Opnd,callInstr->m_func);
        IR::Instr::InsertBefore(pIVar15,pIVar20);
      }
      IR::Instr::UnlinkSrc1(callInstr);
      IR::Instr::UnlinkSrc2(callInstr);
      callInstr->m_opcode = inlineCallOpCode;
      pBVar16 = IR::ByteCodeUsesInstr::New(callInstr);
      pSVar14 = IR::Opnd::GetStackSym(pIVar15->m_src2);
      pIVar20 = (pSVar14->field_5).m_instrDef;
      if ((pIVar20 != (Instr *)0x0 & pSVar14->field_0x18) == 1) {
        local_40 = (RegOpnd *)__tls_get_addr(&PTR_013e5f18);
      }
      else {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        local_40 = (RegOpnd *)__tls_get_addr(&PTR_013e5f18);
        *(undefined4 *)local_40 = 1;
        bVar4 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.h"
                           ,0x1af,"(linkSym->IsSingleDef())","linkSym->IsSingleDef()");
        if (!bVar4) goto LAB_005006fa;
        *(undefined4 *)local_40 = 0;
        pIVar20 = (pSVar14->field_5).m_instrDef;
      }
      do {
        if ((pIVar20->m_src2 == (Opnd *)0x0) ||
           (bVar4 = IR::Opnd::IsSymOpnd(pIVar20->m_src2), !bVar4)) {
          pIVar23 = (Instr *)0x0;
        }
        else {
          pSVar13 = IR::Opnd::AsSymOpnd(pIVar20->m_src2);
          pSVar14 = Sym::AsStackSym(pSVar13->m_sym);
          bVar4 = StackSym::IsArgSlotSym(pSVar14);
          if (!bVar4) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            *(undefined4 *)local_40 = 1;
            bVar4 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.h"
                               ,0x1b8,"(linkSym->IsArgSlotSym())","linkSym->IsArgSlotSym()");
            if (!bVar4) goto LAB_005006fa;
            *(undefined4 *)local_40 = 0;
          }
          if (((((pSVar14->field_0x18 & 1) == 0) || ((pSVar14->field_5).m_instrDef == (Instr *)0x0))
              && (bVar4 = Func::IsInPhase(pIVar15->m_func,FGPeepsPhase), !bVar4)) &&
             (bVar4 = Func::IsInPhase(pIVar15->m_func,FGBuildPhase), !bVar4)) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            *(undefined4 *)local_40 = 1;
            bVar4 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.h"
                               ,0x1bf,
                               "(linkSym->IsSingleDef() || (m_func->IsInPhase(Js::Phase::FGPeepsPhase) || m_func->IsInPhase(Js::Phase::FGBuildPhase)))"
                               ,
                               "linkSym->IsSingleDef() || (m_func->IsInPhase(Js::Phase::FGPeepsPhase) || m_func->IsInPhase(Js::Phase::FGBuildPhase))"
                              );
            if (!bVar4) goto LAB_005006fa;
            *(undefined4 *)local_40 = 0;
          }
          if ((pSVar14->field_0x18 & 1) == 0) {
            pIVar23 = (Instr *)0x0;
          }
          else {
            pIVar23 = (pSVar14->field_5).m_instrDef;
          }
        }
        if (pIVar20->m_opcode != ArgOut_A_InlineSpecialized) {
          if (pIVar20->m_opcode == StartCall) {
            if (pIVar23 != (Instr *)0x0) {
              AssertCount = AssertCount + 1;
              Js::Throw::LogAssert();
              *(undefined4 *)local_40 = 1;
              bVar4 = Js::Throw::ReportAssert
                                ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.h"
                                 ,0x1ce,"(nextArg == nullptr)","nextArg == nullptr");
              if (!bVar4) goto LAB_005006fa;
              *(undefined4 *)local_40 = 0;
            }
            break;
          }
          pSVar14 = IR::Opnd::GetStackSym(pOVar21);
          pSVar14->field_0x19 = pSVar14->field_0x19 | 0x50;
          this_00 = (ByteCodeUsesInstr *)(ulong)(uint)inlineCallOpCode;
          bVar4 = OpCodeAttr::BailOutRec(inlineCallOpCode);
          if (bVar4) {
            this_00 = (ByteCodeUsesInstr *)pIVar20->m_src1;
            pSVar14 = IR::Opnd::GetStackSym((Opnd *)this_00);
            uVar9 = *(uint *)&pSVar14->field_0x18;
            if ((uVar9 >> 0xd & 1) != 0) {
              if (((uVar9 & 1) != 0) &&
                 (this_00 = (ByteCodeUsesInstr *)((pSVar14->field_5).m_instrDef)->m_src1,
                 this_00 != (ByteCodeUsesInstr *)0x0)) {
                bVar4 = IR::Opnd::IsConstOpnd((Opnd *)this_00);
                if (bVar4) goto LAB_005003dc;
                uVar9 = *(uint *)&pSVar14->field_0x18;
              }
              if ((uVar9 >> 0x12 & 1) == 0) {
                RVar10 = StackSym::GetByteCodeRegSlot(pSVar14);
                this_00 = (ByteCodeUsesInstr *)IR::Opnd::GetStackSym(local_58);
                RVar11 = StackSym::GetByteCodeRegSlot((StackSym *)this_00);
                if (RVar10 != RVar11) {
                  this_00 = pBVar16;
                  IR::ByteCodeUsesInstr::Set(pBVar16,pIVar20->m_src1);
                }
              }
            }
          }
LAB_005003dc:
          pOVar21 = ConvertToInlineBuiltInArgOut((Inline *)this_00,pIVar20);
          if (iVar8 == 1) {
            IR::Instr::SetSrc1(callInstr,pOVar21);
            lVar24 = 0x48;
LAB_00500414:
            IR::Opnd::SetIsJITOptimizedReg(*(Opnd **)((long)&callInstr->_vptr_Instr + lVar24),true);
          }
          else if (iVar8 == 2) {
            IR::Instr::SetSrc2(callInstr,pOVar21);
            lVar24 = 0x50;
            goto LAB_00500414;
          }
          iVar8 = iVar8 + -1;
          pOVar21 = pIVar20->m_src2;
          IR::Instr::Move(pIVar20,pIVar19);
          pIVar19 = pIVar20;
        }
        pIVar20 = pIVar23;
      } while (pIVar23 != (Instr *)0x0);
      if ((inlineCallOpCode == InlineMathImul) || (inlineCallOpCode == 0x25b)) {
        func = callInstr->m_func;
        src2Opnd_00 = IR::AddrOpnd::NewFromNumber(0,func,true);
        pRVar22 = IR::RegOpnd::New(TyVar,func);
        IR::Opnd::SetIsJITOptimizedReg(&pRVar22->super_Opnd,true);
        pOVar18 = IR::Instr::UnlinkSrc1(callInstr);
        pIVar19 = IR::Instr::New(Or_A,&pRVar22->super_Opnd,pOVar18,&src2Opnd_00->super_Opnd,func);
        IR::Instr::SetByteCodeOffset(pIVar19,callInstr);
        IR::Instr::InsertBefore(callInstr,pIVar19);
        IR::Instr::SetSrc1(callInstr,&pRVar22->super_Opnd);
        if (inlineCallOpCode == InlineMathImul) {
          bVar4 = IR::Opnd::IsEqual(callInstr->m_src2,callInstr->m_src1);
          if (bVar4) {
            IR::Instr::ReplaceSrc2(callInstr,&pRVar22->super_Opnd);
          }
          else {
            pRVar22 = IR::RegOpnd::New(TyVar,func);
            IR::Opnd::SetIsJITOptimizedReg(&pRVar22->super_Opnd,true);
            pOVar18 = IR::Instr::UnlinkSrc2(callInstr);
            pIVar19 = IR::Instr::New(Or_A,&pRVar22->super_Opnd,pOVar18,&src2Opnd_00->super_Opnd,func
                                    );
            IR::Instr::SetByteCodeOffset(pIVar19,callInstr);
            IR::Instr::InsertBefore(callInstr,pIVar19);
            IR::Instr::SetSrc2(callInstr,&pRVar22->super_Opnd);
          }
        }
      }
      bVar4 = OpCodeAttr::BailOutRec(inlineCallOpCode);
      if (bVar4) {
        IR::Instr::InsertBefore(pIVar15,&pBVar16->super_Instr);
      }
      pRVar22 = IR::Opnd::AsRegOpnd(pOVar21);
      if ((pRVar22->m_sym->field_0x18 & 1) == 0) {
        pIVar19 = (Instr *)0x0;
      }
      else {
        pIVar19 = (pRVar22->m_sym->field_5).m_instrDef;
      }
      if (pIVar19->m_opcode != StartCall) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar12 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
        *puVar12 = 1;
        bVar4 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Inline.cpp"
                           ,0x8ea,
                           "(linkOpnd->AsRegOpnd()->m_sym->GetInstrDef()->m_opcode == Js::OpCode::StartCall)"
                           ,
                           "linkOpnd->AsRegOpnd()->m_sym->GetInstrDef()->m_opcode == Js::OpCode::StartCall"
                          );
        if (!bVar4) goto LAB_005006fa;
        *puVar12 = 0;
      }
      pRVar22 = IR::Opnd::AsRegOpnd(pOVar21);
      pIVar19 = (Instr *)0x0;
      if ((pRVar22->m_sym->field_0x18 & 1) != 0) {
        pIVar19 = (pRVar22->m_sym->field_5).m_instrDef;
      }
      uVar7 = IR::Instr::GetArgOutCount(pIVar19,false);
      if (uVar7 != AVar6) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar12 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
        *puVar12 = 1;
        bVar4 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Inline.cpp"
                           ,0x8eb,
                           "(linkOpnd->AsRegOpnd()->m_sym->GetInstrDef()->GetArgOutCount( false) == actualCount)"
                           ,
                           "linkOpnd->AsRegOpnd()->m_sym->GetInstrDef()->GetArgOutCount( false) == actualCount"
                          );
        if (!bVar4) {
LAB_005006fa:
          pcVar3 = (code *)invalidInstructionException();
          (*pcVar3)();
        }
        *puVar12 = 0;
      }
      pRVar22 = IR::Opnd::AsRegOpnd(pOVar21);
      puVar1 = &pRVar22->m_sym->field_0x18;
      *(uint *)puVar1 = *(uint *)puVar1 | 0x4000;
      bVar4 = OpCodeAttr::BailOutRec(inlineCallOpCode);
      if (bVar4) {
        IR::Instr::ConvertToBailOutInstr(callInstr,callInstr,BailOutOnFloor,0xffffffff);
      }
    }
    pIVar15 = pIVar15->m_next;
  }
  else {
    pIVar15 = callInstr->m_next;
  }
  return pIVar15;
}

Assistant:

IR::Instr *
Inline::InlineBuiltInFunction(
    IR::Instr *callInstr,
    const FunctionJITTimeInfo * inlineeData,
    Js::OpCode inlineCallOpCode,
    const FunctionJITTimeInfo * inlinerData, 
    const StackSym *symCallerThis, 
    bool* pIsInlined, 
    uint profileId, 
    uint recursiveInlineDepth, 
    IR::Instr * funcObjCheckInsertInstr)
{
    Assert(callInstr);
    Assert(inlinerData);
    Assert(inlineCallOpCode != 0);

    // We may still decide not to inline.
    *pIsInlined = false;

    // Inlining is profile-based, so get the built-in function from profile rather than from the callInstr's opnd.
    Js::BuiltinFunction builtInId = Js::JavascriptLibrary::GetBuiltInForFuncInfo(inlineeData->GetLocalFunctionId());
    if (!CanInlineBuiltInFunction(callInstr, inlineeData, inlineCallOpCode, inlinerData, builtInId, false))
    {
        return callInstr->m_next;
    }

    Js::BuiltInFlags builtInFlags = Js::JavascriptLibrary::GetFlagsForBuiltIn(builtInId);
    IR::Opnd * linkOpnd = callInstr->GetSrc2();
    Js::ArgSlot actualCount = linkOpnd->AsSymOpnd()->m_sym->AsStackSym()->GetArgSlotNum();

    bool usesThisArgument = (builtInFlags & Js::BuiltInFlags::BIF_UseSrc0) != 0;
    int inlineCallArgCount = (int)(usesThisArgument ? actualCount : actualCount - 1);

    IR::Instr *inlineBuiltInEndInstr = nullptr;
    if (inlineCallOpCode == Js::OpCode::InlineFunctionApply)
    {
        return InlineApply(callInstr, inlineeData, inlinerData, symCallerThis, pIsInlined, profileId, recursiveInlineDepth, inlineCallArgCount - (usesThisArgument ? 1 : 0));
    }

    if (inlineCallOpCode == Js::OpCode::InlineFunctionCall || inlineCallOpCode == Js::OpCode::InlineCallInstanceFunction)
    {
        const bool isCallInstanceFunction = (inlineCallOpCode == Js::OpCode::InlineCallInstanceFunction);
        return InlineCall(callInstr, inlineeData, inlinerData, symCallerThis, pIsInlined, profileId, recursiveInlineDepth, isCallInstanceFunction);
    }

#if defined(ENABLE_DEBUG_CONFIG_OPTIONS)
    TraceInlining(inlinerData, Js::JavascriptLibrary::GetNameForBuiltIn(builtInId),
        nullptr, 0, this->topFunc->GetWorkItem()->GetJITTimeInfo(), 0, nullptr, profileId, callInstr->m_func->GetTopFunc()->IsLoopBody(), builtInId);
#endif

    // From now on we are committed to inlining.
    *pIsInlined = true;

    // Save off the call target operand (function object) so we can extend its lifetime as needed, even if
    // the call instruction gets transformed to CallIFixed.
    StackSym* originalCallTargetStackSym = callInstr->GetSrc1()->GetStackSym();
    bool originalCallTargetOpndIsJITOpt = callInstr->GetSrc1()->GetIsJITOptimizedReg();

    IR::ByteCodeUsesInstr* useCallTargetInstr = EmitFixedMethodOrFunctionObjectChecksForBuiltIns(callInstr, funcObjCheckInsertInstr, inlineeData, false, true, false, true);

    // To push function object for cases when we have to make calls to helper method to assist in inlining
    if (inlineCallOpCode == Js::OpCode::CallDirect)
    {
        IR::Instr* argoutInstr;
        StackSym *dstSym = callInstr->m_func->m_symTable->GetArgSlotSym((uint16)(1));
        argoutInstr = IR::Instr::New(Js::OpCode::ArgOut_A_InlineSpecialized, IR::SymOpnd::New(dstSym, 0, TyMachPtr, callInstr->m_func), callInstr->UnlinkSrc1(), callInstr->UnlinkSrc2(), callInstr->m_func);
        argoutInstr->SetByteCodeOffset(callInstr);
        callInstr->GetInsertBeforeByteCodeUsesInstr()->InsertBefore(argoutInstr);

        Js::BuiltinFunction builtInFunctionId = Js::JavascriptLibrary::GetBuiltInForFuncInfo(inlineeData->GetLocalFunctionId());


        callInstr->m_opcode = inlineCallOpCode;
        SetupInlineInstrForCallDirect(builtInFunctionId, callInstr, argoutInstr);

        WrapArgsOutWithCoerse(builtInFunctionId, callInstr);

        // Generate ByteCodeArgOutCaptures and move the ArgOut_A/ArgOut_A_Inline close to the call instruction
        callInstr->MoveArgs(/*generateByteCodeCapture*/ true);

        inlineBuiltInEndInstr = callInstr;
    }
    else
    {
        inlineBuiltInEndInstr = InsertInlineeBuiltInStartEndTags(callInstr, actualCount);

        // InlineArrayPop - TrackCalls Need to be done at InlineArrayPop and not at the InlineBuiltInEnd
        // Hence we use a new opcode, to detect that it is an InlineArrayPop and we don't track the call during End of inlineBuiltInCall sequence
        if (inlineCallOpCode == Js::OpCode::InlineArrayPop)
        {
            inlineBuiltInEndInstr->m_opcode = Js::OpCode::InlineNonTrackingBuiltInEnd;
        }
    }

    if (useCallTargetInstr)
    {
        useCallTargetInstr->Unlink();
        callInstr->InsertBefore(useCallTargetInstr);
    }

    if (Js::JavascriptLibrary::IsTypeSpecRequired(builtInFlags))
    {
        // Emit byteCodeUses for function object
        IR::Instr * inlineBuiltInStartInstr = inlineBuiltInEndInstr;
        while (inlineBuiltInStartInstr->m_opcode != Js::OpCode::InlineBuiltInStart)
        {
            inlineBuiltInStartInstr = inlineBuiltInStartInstr->m_prev;
        }

        IR::Opnd * tmpDst = nullptr;
        IR::Opnd * callInstrDst = callInstr->GetDst();

        if (callInstrDst && inlineCallOpCode != Js::OpCode::InlineArrayPop)
        {
            StackSym * tmpSym = StackSym::New(callInstr->GetDst()->GetType(), callInstr->m_func);
            tmpDst = IR::RegOpnd::New(tmpSym, tmpSym->GetType(), callInstr->m_func);

            callInstrDst = callInstr->UnlinkDst();
            callInstr->SetDst(tmpDst);
        }
        else
        {
            AssertMsg(inlineCallOpCode == Js::OpCode::InlineArrayPush || inlineCallOpCode == Js::OpCode::InlineArrayPop,
                "Currently Dst can be null only for InlineArrayPush/InlineArrayPop");
        }

        // Insert a byteCodeUsesInstr to make sure the function object's lifetime is extended beyond the last bailout point
        // at which we may need to call the inlinee again in the interpreter.
        useCallTargetInstr = IR::ByteCodeUsesInstr::New(callInstr->GetPrevRealInstrOrLabel());
        useCallTargetInstr->SetRemovedOpndSymbol(originalCallTargetOpndIsJITOpt, originalCallTargetStackSym->m_id);

        if (inlineCallOpCode == Js::OpCode::InlineArrayPop)
        {
            callInstr->InsertBefore(useCallTargetInstr);
        }
        else
        {
            inlineBuiltInEndInstr->InsertBefore(useCallTargetInstr);
        }

        if (tmpDst)
        {
            IR::Instr * ldInstr = IR::Instr::New(Func::GetLoadOpForType(callInstrDst->GetType()), callInstrDst, tmpDst, callInstr->m_func);
            inlineBuiltInEndInstr->InsertBefore(ldInstr);
        }

        // Set srcs of the callInstr, and process ArgOuts.
        callInstr->UnlinkSrc1();
        callInstr->UnlinkSrc2();
        callInstr->m_opcode = inlineCallOpCode;

        int argIndex = inlineCallArgCount;    // We'll use it to fill call instr srcs from upper to lower.


        IR::ByteCodeUsesInstr * byteCodeUsesInstr = IR::ByteCodeUsesInstr::New(callInstr);
        IR::Instr *argInsertInstr = inlineBuiltInStartInstr;

        inlineBuiltInEndInstr->IterateArgInstrs([&](IR::Instr* argInstr) {
            StackSym *linkSym = linkOpnd->GetStackSym();
            linkSym->m_isInlinedArgSlot = true;
            linkSym->m_allocated = true;

            // We are going to replace the use on the call (below), insert byte code use if necessary
            if (OpCodeAttr::BailOutRec(inlineCallOpCode))
            {
                StackSym * sym = argInstr->GetSrc1()->GetStackSym();
                if (sym->HasByteCodeRegSlot() && (!sym->m_isSingleDef || !sym->m_instrDef->GetSrc1() || !sym->m_instrDef->GetSrc1()->IsConstOpnd()))
                {
                    if (!sym->IsFromByteCodeConstantTable() && sym->GetByteCodeRegSlot() != callInstrDst->GetStackSym()->GetByteCodeRegSlot())
                    {
                        byteCodeUsesInstr->Set(argInstr->GetSrc1());
                    }
                }
            }

            // Convert the arg out to built in arg out, and get the src of the arg out
            IR::Opnd * argOpnd = ConvertToInlineBuiltInArgOut(argInstr);
            // Use parameter to the inline call to tempDst.
            if (argIndex == 2)
            {
                callInstr->SetSrc2(argOpnd);
                // Prevent inserting ByteCodeUses instr during globopt, as we already track the src in ArgOut.
                callInstr->GetSrc2()->SetIsJITOptimizedReg(true);
            }
            else if (argIndex == 1)
            {
                callInstr->SetSrc1(argOpnd);
                // Prevent inserting ByteCodeUses instr during globopt, as we already track the src in ArgOut.
                callInstr->GetSrc1()->SetIsJITOptimizedReg(true);
            }

            argIndex--;

            linkOpnd = argInstr->GetSrc2();

            // Move the arguments next to the call.
            argInstr->Move(argInsertInstr);
            argInsertInstr = argInstr;
            return false;
        });

        if (inlineCallOpCode == Js::OpCode::InlineMathImul || inlineCallOpCode == Js::OpCode::InlineMathClz)
        {
            // Convert:
            //     s1 = InlineMathImul s2, s3
            // Into:
            //     s4 = Or_A s2, 0
            //     s5 = Or_A s3, 0
            //     s1 = InlineMathImul s4, s5

            Func *const func = callInstr->m_func;
            IR::AddrOpnd *const zeroOpnd = IR::AddrOpnd::NewFromNumber(0, func, true);

            IR::RegOpnd *const s4 = IR::RegOpnd::New(TyVar, func);
            s4->SetIsJITOptimizedReg(true);
            IR::Instr *orInstr = IR::Instr::New(Js::OpCode::Or_A, s4, callInstr->UnlinkSrc1(), zeroOpnd, func);
            orInstr->SetByteCodeOffset(callInstr);
            callInstr->InsertBefore(orInstr);
            callInstr->SetSrc1(s4);
            if (inlineCallOpCode == Js::OpCode::InlineMathImul)
            {
                if (callInstr->GetSrc2()->IsEqual(callInstr->GetSrc1()))
                {
                    callInstr->ReplaceSrc2(s4);
                }
                else
                {
                    IR::RegOpnd *const s5 = IR::RegOpnd::New(TyVar, func);
                    s5->SetIsJITOptimizedReg(true);
                    orInstr = IR::Instr::New(Js::OpCode::Or_A, s5, callInstr->UnlinkSrc2(), zeroOpnd, func);
                    orInstr->SetByteCodeOffset(callInstr);
                    callInstr->InsertBefore(orInstr);
                    callInstr->SetSrc2(s5);
                }
            }
        }

        if (OpCodeAttr::BailOutRec(inlineCallOpCode))
        {
            inlineBuiltInEndInstr->InsertBefore(byteCodeUsesInstr);
        }

        Assert(linkOpnd->AsRegOpnd()->m_sym->GetInstrDef()->m_opcode == Js::OpCode::StartCall);
        Assert(linkOpnd->AsRegOpnd()->m_sym->GetInstrDef()->GetArgOutCount(/*getInterpreterArgOutCount*/ false) == actualCount);

        // Mark the StartCall's dst as an inlined arg slot as well so we know this is an inlined start call
        // and not adjust the stack height on x86
        linkOpnd->AsRegOpnd()->m_sym->m_isInlinedArgSlot = true;

        if (OpCodeAttr::BailOutRec(inlineCallOpCode))
        {
            callInstr = callInstr->ConvertToBailOutInstr(callInstr, IR::BailOutOnFloor);
        }
    }
    return inlineBuiltInEndInstr->m_next;
}